

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O0

void __thiscall AwsCommandRunner_Finished_Test::TestBody(AwsCommandRunner_Finished_Test *this)

{
  bool bVar1;
  MockSpec<bool_()> *pMVar2;
  TypedExpectation<bool_()> *pTVar3;
  char *pcVar4;
  char *in_R9;
  string local_390;
  AssertHelper local_370;
  Message local_368;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__1;
  string local_340;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  undefined1 local_278 [8];
  AwsCommandRunner aws_command_runner;
  Action<bool_()> local_1f0;
  ReturnAction<bool> local_1e0;
  Action<bool_()> local_1d0;
  ReturnAction<bool> local_1c0;
  Action<bool_()> local_1b0 [2];
  undefined1 local_190 [8];
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  AwsCommandRunner_Finished_Test *this_local;
  
  anon_unknown.dwarf_e710::MockCommandRunner::MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  MultipleCommandRunner::MultipleCommandRunner
            ((MultipleCommandRunner *)local_190,
             (CommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  pMVar2 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_Finished
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_);
  pTVar3 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x1b,"command_runner","Finished()");
  pTVar3 = testing::internal::TypedExpectation<bool_()>::Times(pTVar3,2);
  testing::Return<bool>((testing *)&local_1c0,false);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)local_1b0);
  pTVar3 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar3,local_1b0);
  testing::Return<bool>((testing *)&local_1e0,true);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1d0);
  testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar3,&local_1d0);
  testing::Action<bool_()>::~Action(&local_1d0);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_1e0);
  testing::Action<bool_()>::~Action(local_1b0);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_1c0);
  pMVar2 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_PreviousCommandFailed
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_);
  pTVar3 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x1f,"command_runner","PreviousCommandFailed()");
  testing::Return<bool>
            ((testing *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             false);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1f0);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly(pTVar3,&local_1f0);
  testing::Action<bool_()>::~Action(&local_1f0);
  testing::internal::ReturnAction<bool>::~ReturnAction
            ((ReturnAction<bool> *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"/tmp/",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"unused",&local_2c1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&gtest_ar_.message_);
  AwsCommandRunner::AwsCommandRunner
            ((AwsCommandRunner *)local_278,(MultipleCommandRunner *)local_190,&local_298,&local_2c0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar_.message_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  bVar1 = AwsCommandRunner::Finished((AwsCommandRunner *)local_278);
  local_309 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_340,(internal *)local_308,(AssertionResult *)"aws_command_runner.Finished()",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x24,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    testing::Message::~Message(&local_318);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    local_359 = AwsCommandRunner::Finished((AwsCommandRunner *)local_278);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_358,&local_359,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_390,(internal *)local_358,(AssertionResult *)"aws_command_runner.Finished()"
                 ,"false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_370,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                 ,0x25,pcVar4);
      testing::internal::AssertHelper::operator=(&local_370,&local_368);
      testing::internal::AssertHelper::~AssertHelper(&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      testing::Message::~Message(&local_368);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      gtest_ar__1.message_.ptr_._4_4_ = 0;
    }
  }
  AwsCommandRunner::~AwsCommandRunner((AwsCommandRunner *)local_278);
  MultipleCommandRunner::~MultipleCommandRunner((MultipleCommandRunner *)local_190);
  anon_unknown.dwarf_e710::MockCommandRunner::~MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  return;
}

Assistant:

TEST(AwsCommandRunner, Finished) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner, Finished())
      .Times(2)
      .WillOnce(Return(false))
      .WillOnce(Return(true));
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .WillRepeatedly(Return(false));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "unused", {});
  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_TRUE(aws_command_runner.Finished());
}